

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeDouble(ParserImpl *this,double *value)

{
  TokenType TVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  string text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&text,"-",(allocator *)&local_48);
  bVar2 = TryConsume(this,&text);
  std::__cxx11::string::~string((string *)&text);
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 == TYPE_IDENTIFIER) {
    std::__cxx11::string::string((string *)&text,(string *)&(this->tokenizer_).current_.text);
    LowerString(&text);
    bVar3 = std::operator==(&text,"inf");
    dVar4 = INFINITY;
    if (!bVar3) {
      bVar3 = std::operator==(&text,"infinity");
      dVar4 = INFINITY;
      if (!bVar3) {
        bVar3 = std::operator==(&text,"nan");
        if (!bVar3) {
          std::operator+(&local_48,"Expected double, got: ",&text);
          ReportError(this,&local_48);
          std::__cxx11::string::~string((string *)&local_48);
          goto LAB_002832f1;
        }
        dVar4 = NAN;
      }
    }
    *value = dVar4;
    io::Tokenizer::Next(&this->tokenizer_);
    std::__cxx11::string::~string((string *)&text);
  }
  else {
    if (TVar1 == TYPE_INTEGER) {
      bVar3 = ConsumeUnsignedDecimalAsDouble(this,value,0xffffffffffffffff);
      if (!bVar2 || !bVar3) {
        return bVar3;
      }
      goto LAB_002832be;
    }
    if (TVar1 != TYPE_FLOAT) {
      std::operator+(&text,"Expected double, got: ",&(this->tokenizer_).current_.text);
      ReportError(this,&text);
LAB_002832f1:
      std::__cxx11::string::~string((string *)&text);
      return false;
    }
    dVar4 = io::Tokenizer::ParseFloat(&(this->tokenizer_).current_.text);
    *value = dVar4;
    io::Tokenizer::Next(&this->tokenizer_);
  }
  if (!bVar2) {
    return true;
  }
LAB_002832be:
  *value = -*value;
  return true;
}

Assistant:

bool ConsumeDouble(double* value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
    }

    // A double can actually be an integer, according to the tokenizer.
    // Therefore, we must check both cases here.
    if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      // We have found an integer value for the double.
      DO(ConsumeUnsignedDecimalAsDouble(value, kuint64max));
    } else if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
      // We have found a float value for the double.
      *value = io::Tokenizer::ParseFloat(tokenizer_.current().text);

      // Mark the current token as consumed.
      tokenizer_.Next();
    } else if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      LowerString(&text);
      if (text == "inf" ||
          text == "infinity") {
        *value = std::numeric_limits<double>::infinity();
        tokenizer_.Next();
      } else if (text == "nan") {
        *value = std::numeric_limits<double>::quiet_NaN();
        tokenizer_.Next();
      } else {
        ReportError("Expected double, got: " + text);
        return false;
      }
    } else {
      ReportError("Expected double, got: " + tokenizer_.current().text);
      return false;
    }

    if (negative) {
      *value = -*value;
    }

    return true;
  }